

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_debug.c
# Opt level: O2

char * find_hooked_symbol(void)

{
  uint uVar1;
  void *__ptr;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  void *buffer [100];
  
  uVar1 = backtrace(buffer,100);
  __ptr = (void *)backtrace_symbols(buffer,uVar1);
  if (__ptr == (void *)0x0) {
    perror("backtrace_symbols");
    exit(1);
  }
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  pcVar3 = (char *)0x0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pcVar4 = *(char **)((long)__ptr + uVar5 * 8);
    pcVar2 = strstr(pcVar4,"libapprun_hooks.so");
    if (((pcVar2 != (char *)0x0) &&
        (pcVar2 = strstr(pcVar4,"__libc_start_main"), pcVar2 == (char *)0x0)) &&
       (pcVar2 = strstr(pcVar4,"main_hook"), pcVar2 == (char *)0x0)) {
      pcVar3 = pcVar4;
    }
  }
  if ((pcVar3 != (char *)0x0) && (pcVar3 = strchr(pcVar3,0x28), pcVar3 != (char *)0x0)) {
    pcVar4 = strchr(pcVar3,0x2b);
    pcVar3 = strndup(pcVar3 + 1,(size_t)(pcVar4 + ~(ulong)pcVar3));
    free(__ptr);
    return pcVar3;
  }
  pcVar3 = strdup("UNKNOWN");
  return pcVar3;
}

Assistant:

char *find_hooked_symbol() {
    int nptrs;
    void *buffer[BT_BUF_SIZE];
    char **strings;

    nptrs = backtrace(buffer, BT_BUF_SIZE);

    /* The call backtrace_symbols_fd(buffer, nptrs, STDOUT_FILENO)
       would produce similar output to the following: */

    strings = backtrace_symbols(buffer, nptrs);
    if (strings == NULL) {
        perror("backtrace_symbols");
        exit(EXIT_FAILURE);
    }
    char *apprun_hooks_entry = NULL;
    for (int j = 0; j < nptrs; j++) {
        if ((strstr(strings[j], "libapprun_hooks.so") != NULL)
            && (strstr(strings[j], "__libc_start_main") == NULL)
            && (strstr(strings[j], "main_hook") == NULL)) {
            apprun_hooks_entry = strings[j];
        }
    }

    char *symbol_name_being = apprun_hooks_entry != NULL ? strstr(apprun_hooks_entry, "(") : NULL;

    // symbol name lookup is not perfect, in case of failure just return UNKNOWN
    if (symbol_name_being == NULL)
        return strdup("UNKNOWN");

    char *symbol_name_end = strstr(symbol_name_being, "+");
    char *symbol_name = strndup(symbol_name_being + 1, symbol_name_end - symbol_name_being - 1);

    free(strings);
    return symbol_name;
}